

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O1

void __thiscall jsonnet::internal::CompilerPass::visit(CompilerPass *this,Index *ast)

{
  AST **ppAVar1;
  
  (*this->_vptr_CompilerPass[6])(this,&ast->target);
  if (ast->id != (Identifier *)0x0) {
    return;
  }
  ppAVar1 = &ast->index;
  if (ast->isSlice == true) {
    if (*ppAVar1 != (AST *)0x0) {
      (*this->_vptr_CompilerPass[6])(this);
    }
    if (ast->end != (AST *)0x0) {
      (*this->_vptr_CompilerPass[6])(this,&ast->end);
    }
    if (ast->step == (AST *)0x0) {
      return;
    }
    ppAVar1 = &ast->step;
  }
  (*this->_vptr_CompilerPass[6])(this,ppAVar1);
  return;
}

Assistant:

void CompilerPass::visit(Index *ast)
{
    expr(ast->target);
    if (ast->id != nullptr) {
    } else {
        if (ast->isSlice) {
            if (ast->index != nullptr)
                expr(ast->index);
            if (ast->end != nullptr)
                expr(ast->end);
            if (ast->step != nullptr)
                expr(ast->step);
        } else {
            expr(ast->index);
        }
    }
}